

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

void __thiscall
Opcode::AABBTreeCollider::_Collide
          (AABBTreeCollider *this,AABBCollisionNode *b0,AABBCollisionNode *b1)

{
  bool bVar1;
  Point *pPVar2;
  Point *pPVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  AABBCollisionNode *b1_local;
  AABBCollisionNode *b0_local;
  AABBTreeCollider *this_local;
  float Tz;
  float Ty;
  float Tx;
  float t2;
  float t;
  
  pPVar3 = &(b0->mAABB).mExtents;
  pPVar2 = &(b1->mAABB).mExtents;
  this->mNbBVBVTests = this->mNbBVBVTests + 1;
  fVar4 = ((this->mR1to0).m[2][0] * (b1->mAABB).mCenter.z +
           (this->mR1to0).m[0][0] * (b1->mAABB).mCenter.x +
           (this->mR1to0).m[1][0] * (b1->mAABB).mCenter.y + (this->mT1to0).x) -
          (b0->mAABB).mCenter.x;
  if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[2][0] +
            (b1->mAABB).mExtents.y * (this->mAR).m[1][0] +
            pPVar2->x * (this->mAR).m[0][0] + pPVar3->x) < (uint)ABS(fVar4)) {
    bVar1 = false;
  }
  else {
    fVar5 = ((this->mR1to0).m[2][1] * (b1->mAABB).mCenter.z +
             (this->mR1to0).m[0][1] * (b1->mAABB).mCenter.x +
             (this->mR1to0).m[1][1] * (b1->mAABB).mCenter.y + (this->mT1to0).y) -
            (b0->mAABB).mCenter.y;
    if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[2][1] +
              (b1->mAABB).mExtents.y * (this->mAR).m[1][1] +
              pPVar2->x * (this->mAR).m[0][1] + (b0->mAABB).mExtents.y) < (uint)ABS(fVar5)) {
      bVar1 = false;
    }
    else {
      fVar6 = ((this->mR1to0).m[2][2] * (b1->mAABB).mCenter.z +
               (this->mR1to0).m[0][2] * (b1->mAABB).mCenter.x +
               (this->mR1to0).m[1][2] * (b1->mAABB).mCenter.y + (this->mT1to0).z) -
              (b0->mAABB).mCenter.z;
      if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[2][2] +
                (b1->mAABB).mExtents.y * (this->mAR).m[1][2] +
                pPVar2->x * (this->mAR).m[0][2] + (b0->mAABB).mExtents.z) < (uint)ABS(fVar6)) {
        bVar1 = false;
      }
      else if ((uint)((b0->mAABB).mExtents.z * (this->mAR).m[0][2] +
                      pPVar3->x * (this->mAR).m[0][0] + (b0->mAABB).mExtents.y * (this->mAR).m[0][1]
                     + pPVar2->x) <
               (uint)ABS(fVar6 * (this->mR1to0).m[0][2] +
                         fVar4 * (this->mR1to0).m[0][0] + fVar5 * (this->mR1to0).m[0][1])) {
        bVar1 = false;
      }
      else if ((uint)((b0->mAABB).mExtents.z * (this->mAR).m[1][2] +
                      pPVar3->x * (this->mAR).m[1][0] + (b0->mAABB).mExtents.y * (this->mAR).m[1][1]
                     + (b1->mAABB).mExtents.y) <
               (uint)ABS(fVar6 * (this->mR1to0).m[1][2] +
                         fVar4 * (this->mR1to0).m[1][0] + fVar5 * (this->mR1to0).m[1][1])) {
        bVar1 = false;
      }
      else if ((uint)((b0->mAABB).mExtents.z * (this->mAR).m[2][2] +
                      pPVar3->x * (this->mAR).m[2][0] + (b0->mAABB).mExtents.y * (this->mAR).m[2][1]
                     + (b1->mAABB).mExtents.z) <
               (uint)ABS(fVar6 * (this->mR1to0).m[2][2] +
                         fVar4 * (this->mR1to0).m[2][0] + fVar5 * (this->mR1to0).m[2][1])) {
        bVar1 = false;
      }
      else {
        if (((this->mFullBoxBoxTest & 1U) != 0) || (this->mNbBVBVTests == 1)) {
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[1][0] +
                    (b1->mAABB).mExtents.y * (this->mAR).m[2][0] +
                    (b0->mAABB).mExtents.y * (this->mAR).m[0][2] +
                    (b0->mAABB).mExtents.z * (this->mAR).m[0][1]) <
              (uint)ABS(fVar6 * (this->mR1to0).m[0][1] + -(fVar5 * (this->mR1to0).m[0][2]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[0][0] +
                    pPVar2->x * (this->mAR).m[2][0] +
                    (b0->mAABB).mExtents.y * (this->mAR).m[1][2] +
                    (b0->mAABB).mExtents.z * (this->mAR).m[1][1]) <
              (uint)ABS(fVar6 * (this->mR1to0).m[1][1] + -(fVar5 * (this->mR1to0).m[1][2]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.y * (this->mAR).m[0][0] +
                    pPVar2->x * (this->mAR).m[1][0] +
                    (b0->mAABB).mExtents.y * (this->mAR).m[2][2] +
                    (b0->mAABB).mExtents.z * (this->mAR).m[2][1]) <
              (uint)ABS(fVar6 * (this->mR1to0).m[2][1] + -(fVar5 * (this->mR1to0).m[2][2]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[1][1] +
                    (b1->mAABB).mExtents.y * (this->mAR).m[2][1] +
                    pPVar3->x * (this->mAR).m[0][2] + (b0->mAABB).mExtents.z * (this->mAR).m[0][0])
              < (uint)ABS(fVar4 * (this->mR1to0).m[0][2] + -(fVar6 * (this->mR1to0).m[0][0]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[0][1] +
                    pPVar2->x * (this->mAR).m[2][1] +
                    pPVar3->x * (this->mAR).m[1][2] + (b0->mAABB).mExtents.z * (this->mAR).m[1][0])
              < (uint)ABS(fVar4 * (this->mR1to0).m[1][2] + -(fVar6 * (this->mR1to0).m[1][0]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.y * (this->mAR).m[0][1] +
                    pPVar2->x * (this->mAR).m[1][1] +
                    pPVar3->x * (this->mAR).m[2][2] + (b0->mAABB).mExtents.z * (this->mAR).m[2][0])
              < (uint)ABS(fVar4 * (this->mR1to0).m[2][2] + -(fVar6 * (this->mR1to0).m[2][0]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[1][2] +
                    (b1->mAABB).mExtents.y * (this->mAR).m[2][2] +
                    pPVar3->x * (this->mAR).m[0][1] + (b0->mAABB).mExtents.y * (this->mAR).m[0][0])
              < (uint)ABS(fVar5 * (this->mR1to0).m[0][0] + -(fVar4 * (this->mR1to0).m[0][1]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.z * (this->mAR).m[0][2] +
                    pPVar2->x * (this->mAR).m[2][2] +
                    pPVar3->x * (this->mAR).m[1][1] + (b0->mAABB).mExtents.y * (this->mAR).m[1][0])
              < (uint)ABS(fVar5 * (this->mR1to0).m[1][0] + -(fVar4 * (this->mR1to0).m[1][1]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
          if ((uint)((b1->mAABB).mExtents.y * (this->mAR).m[0][2] +
                    pPVar2->x * (this->mAR).m[1][2] +
                    pPVar3->x * (this->mAR).m[2][1] + (b0->mAABB).mExtents.y * (this->mAR).m[2][0])
              < (uint)ABS(fVar5 * (this->mR1to0).m[2][0] + -(fVar4 * (this->mR1to0).m[2][1]))) {
            bVar1 = false;
            goto LAB_00263602;
          }
        }
        bVar1 = true;
      }
    }
  }
LAB_00263602:
  if (bVar1) {
    if ((b0->mData & 1) == 0) {
      if ((b1->mData & 1) == 0) {
        _Collide(this,(AABBCollisionNode *)(b0->mData + 0x20),
                 (AABBCollisionNode *)(b1->mData + 0x20));
        if (((((this->super_Collider).mFlags & 5) != 5) &&
            (_Collide(this,(AABBCollisionNode *)(b0->mData + 0x20),(AABBCollisionNode *)b1->mData),
            ((this->super_Collider).mFlags & 5) != 5)) &&
           (_Collide(this,(AABBCollisionNode *)b0->mData,(AABBCollisionNode *)(b1->mData + 0x20)),
           ((this->super_Collider).mFlags & 5) != 5)) {
          _Collide(this,(AABBCollisionNode *)b0->mData,(AABBCollisionNode *)b1->mData);
        }
      }
      else {
        _Collide(this,(AABBCollisionNode *)(b0->mData + 0x20),b1);
        if (((this->super_Collider).mFlags & 5) != 5) {
          _Collide(this,(AABBCollisionNode *)b0->mData,b1);
        }
      }
    }
    else if ((b1->mData & 1) == 0) {
      _Collide(this,b0,(AABBCollisionNode *)(b1->mData + 0x20));
      if (((this->super_Collider).mFlags & 5) != 5) {
        _Collide(this,b0,(AABBCollisionNode *)b1->mData);
      }
    }
    else {
      PrimTest(this,(udword)(b0->mData >> 1),(udword)(b1->mData >> 1));
    }
  }
  return;
}

Assistant:

void AABBTreeCollider::_Collide(const AABBCollisionNode* b0, const AABBCollisionNode* b1)
{
	// Perform BV-BV overlap test
	if(!BoxBoxOverlap(b0->mAABB.mExtents, b0->mAABB.mCenter, b1->mAABB.mExtents, b1->mAABB.mCenter))
	{
		return;
	}

	if(b0->IsLeaf())
	{
		if(b1->IsLeaf())
		{
			PrimTest(b0->GetPrimitive(), b1->GetPrimitive());
		}
		else
		{
			_Collide(b0, b1->GetNeg());
			if(ContactFound()) return;
			_Collide(b0, b1->GetPos());
		}
	}
	else if(b1->IsLeaf())
	{
		_Collide(b0->GetNeg(), b1);
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1);
	}
	else
	{
		_Collide(b0->GetNeg(), b1->GetNeg());
		if(ContactFound()) return;
		_Collide(b0->GetNeg(), b1->GetPos());
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1->GetNeg());
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1->GetPos());
	}
}